

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# switch.cpp
# Opt level: O2

void __thiscall QtMWidgets::Switch::mouseReleaseEvent(Switch *this,QMouseEvent *event)

{
  int iVar1;
  int iVar2;
  int iVar3;
  State st;
  SwitchPrivate *pSVar4;
  QRect QVar5;
  QRect local_38;
  
  if (*(int *)(event + 0x40) != 1) {
    event[0xc] = (QMouseEvent)0x0;
    return;
  }
  event[0xc] = (QMouseEvent)0x1;
  ((this->d).d)->leftMouseButtonPressed = false;
  QVar5 = QWidget::rect(&this->super_QWidget);
  pSVar4 = (this->d).d;
  iVar1 = pSVar4->radius;
  iVar2 = pSVar4->mouseMoveDelta;
  iVar3 = FingerGeometry::touchBounce();
  if (iVar3 < iVar2) {
    pSVar4 = (this->d).d;
    if (((QVar5.x2 - (QVar5.x1 + iVar1 * 2)) + 1) / 2 < pSVar4->offset) {
      if (pSVar4->state < NotAcceptedCheck) {
        st = NotAcceptedCheck;
        goto LAB_00187ac5;
      }
LAB_00187a94:
      local_38 = QWidget::rect(&this->super_QWidget);
      SwitchPrivate::initOffset(pSVar4,&local_38);
      QWidget::update();
      return;
    }
    if ((pSVar4->state & ~AcceptedUncheck) != NotAcceptedCheck) goto LAB_00187a94;
  }
  else {
    pSVar4 = (this->d).d;
    if (pSVar4->state < NotAcceptedCheck) {
      st = NotAcceptedCheck;
      goto LAB_00187ac5;
    }
    if (1 < pSVar4->state - NotAcceptedCheck) {
      return;
    }
  }
  st = NotAcceptedUncheck;
LAB_00187ac5:
  SwitchPrivate::setState(pSVar4,st);
  return;
}

Assistant:

void
Switch::mouseReleaseEvent( QMouseEvent * event )
{
	if( event->button() == Qt::LeftButton )
	{
		event->accept();

		d->leftMouseButtonPressed = false;

		const int distance = rect().width() - d->radius * 2;

		if( d->mouseMoveDelta <= FingerGeometry::touchBounce() )
		{
			switch( d->state )
			{
				case NotAcceptedCheck :
				case AcceptedCheck :
					d->setState( NotAcceptedUncheck );
				break;

				case NotAcceptedUncheck :
				case AcceptedUncheck :
					d->setState( NotAcceptedCheck );
				break;

				default :
					break;
			}

			return;
		}

		if( d->offset <= distance / 2 )
		{
			switch( d->state )
			{
				case NotAcceptedCheck :
				case AcceptedCheck :
					d->setState( NotAcceptedUncheck );
				break;

				default :
				{
					d->initOffset( rect() );
					update();
				}
				break;
			}
		}
		else
		{
			switch( d->state )
			{
				case NotAcceptedUncheck :
				case AcceptedUncheck :
					d->setState( NotAcceptedCheck );
				break;

				default :
				{
					d->initOffset( rect() );
					update();
				}
				break;
			}
		}
	}
	else
		event->ignore();
}